

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void seatHandleCapabilities(void *userData,wl_seat *seat,wl_seat_capability caps)

{
  uint in_EDX;
  wl_pointer *in_RSI;
  undefined4 unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((in_EDX & 1) == 0) || (_glfw.wl.pointer != (wl_pointer *)0x0)) {
    if (((in_EDX & 1) == 0) && (_glfw.wl.pointer != (wl_pointer *)0x0)) {
      wl_pointer_destroy((wl_pointer *)0xc1d5ea);
      _glfw.wl.pointer = (wl_pointer *)0x0;
    }
  }
  else {
    _glfw.wl.pointer = wl_seat_get_pointer((wl_seat *)CONCAT44(caps,unaff_retaddr));
    wl_pointer_add_listener
              (in_RSI,(wl_pointer_listener *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (void *)0xc1d5b8);
  }
  if (((in_EDX & 2) == 0) || (_glfw.wl.keyboard != (wl_keyboard *)0x0)) {
    if (((in_EDX & 2) == 0) && (_glfw.wl.keyboard != (wl_keyboard *)0x0)) {
      wl_keyboard_destroy((wl_keyboard *)0xc1d686);
      _glfw.wl.keyboard = (wl_keyboard *)0x0;
    }
  }
  else {
    _glfw.wl.keyboard = wl_seat_get_keyboard((wl_seat *)CONCAT44(caps,unaff_retaddr));
    wl_keyboard_add_listener
              ((wl_keyboard *)in_RSI,
               (wl_keyboard_listener *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(void *)0xc1d654);
  }
  return;
}

Assistant:

static void seatHandleCapabilities(void* userData,
                                   struct wl_seat* seat,
                                   enum wl_seat_capability caps)
{
    if ((caps & WL_SEAT_CAPABILITY_POINTER) && !_glfw.wl.pointer)
    {
        _glfw.wl.pointer = wl_seat_get_pointer(seat);
        wl_pointer_add_listener(_glfw.wl.pointer, &pointerListener, NULL);
    }
    else if (!(caps & WL_SEAT_CAPABILITY_POINTER) && _glfw.wl.pointer)
    {
        wl_pointer_destroy(_glfw.wl.pointer);
        _glfw.wl.pointer = NULL;
    }

    if ((caps & WL_SEAT_CAPABILITY_KEYBOARD) && !_glfw.wl.keyboard)
    {
        _glfw.wl.keyboard = wl_seat_get_keyboard(seat);
        wl_keyboard_add_listener(_glfw.wl.keyboard, &keyboardListener, NULL);
    }
    else if (!(caps & WL_SEAT_CAPABILITY_KEYBOARD) && _glfw.wl.keyboard)
    {
        wl_keyboard_destroy(_glfw.wl.keyboard);
        _glfw.wl.keyboard = NULL;
    }
}